

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O0

string * getDataDirectoryRoot_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined1 local_11;
  string *directory;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  __s = getenv("HOME");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
  std::operator+(&local_38,&local_58,"/.config/");
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return in_RDI;
}

Assistant:

static std::string getDataDirectoryRoot() {
    std::string directory;

#ifdef WIN32
    DWORD bufferSize = GetEnvironmentVariable(L"APPDATA", 0, 0);
    wchar_t *buffer = new wchar_t[bufferSize + 2];
    GetEnvironmentVariable(L"APPDATA", buffer, bufferSize);
    directory.assign(u16to8(buffer));
    delete[] buffer;
#else
    directory = std::string(std::getenv("HOME")) + "/.config/";
#endif

    return directory;
}